

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O1

string * __thiscall
cfd::js::api::json::
ExecuteJsonApi<cfd::js::api::json::CreateSignatureHashRequest,cfd::js::api::json::CreateSignatureHashResponse,cfd::js::api::CreateSignatureHashRequestStruct,cfd::js::api::CreateSignatureHashResponseStruct>
          (string *__return_storage_ptr__,json *this,string *request_message,
          function<cfd::js::api::CreateSignatureHashResponseStruct_(const_cfd::js::api::CreateSignatureHashRequestStruct_&)>
          *call_function)

{
  json *pjVar1;
  undefined8 uVar2;
  CreateSignatureHashResponseStruct response;
  CreateSignatureHashResponse res;
  CreateSignatureHashRequestStruct request;
  CreateSignatureHashRequest req;
  string local_4a8;
  CreateSignatureHashResponseStruct local_488;
  ErrorResponse local_3c0;
  CreateSignatureHashRequestStruct local_308;
  CreateSignatureHashRequest local_1a0;
  
  CreateSignatureHashRequest::CreateSignatureHashRequest(&local_1a0);
  core::JsonClassBase<cfd::js::api::json::CreateSignatureHashRequest>::Deserialize
            (&local_1a0.super_JsonClassBase<cfd::js::api::json::CreateSignatureHashRequest>,
             (string *)this);
  CreateSignatureHashRequest::ConvertToStruct(&local_308,&local_1a0);
  if ((request_message->field_2)._M_allocated_capacity != 0) {
    (**(code **)((long)&request_message->field_2 + 8))(&local_488,request_message,&local_308);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (local_488.error.code == 0) {
      CreateSignatureHashResponse::CreateSignatureHashResponse
                ((CreateSignatureHashResponse *)&local_3c0);
      CreateSignatureHashResponse::ConvertFromStruct
                ((CreateSignatureHashResponse *)&local_3c0,&local_488);
      core::JsonClassBase<cfd::js::api::json::CreateSignatureHashResponse>::Serialize_abi_cxx11_
                (&local_4a8,
                 (JsonClassBase<cfd::js::api::json::CreateSignatureHashResponse> *)&local_3c0);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_4a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
        operator_delete(local_4a8._M_dataplus._M_p);
      }
      CreateSignatureHashResponse::~CreateSignatureHashResponse
                ((CreateSignatureHashResponse *)&local_3c0);
    }
    else {
      ErrorResponse::ConvertFromStruct(&local_3c0,&local_488.error);
      core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_
                (&local_4a8,(JsonClassBase<cfd::js::api::json::ErrorResponseBase> *)&local_3c0);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_4a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
        operator_delete(local_4a8._M_dataplus._M_p);
      }
      local_3c0.super_ErrorResponseBase.super_JsonClassBase<cfd::js::api::json::ErrorResponseBase>.
      _vptr_JsonClassBase = (_func_int **)&PTR__ErrorResponseBase_00a85a68;
      InnerErrorResponse::~InnerErrorResponse(&local_3c0.super_ErrorResponseBase.error_);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_3c0.super_ErrorResponseBase.ignore_items._M_t);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_488.ignore_items._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_488.error.ignore_items._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488.error.message._M_dataplus._M_p != &local_488.error.message.field_2) {
      operator_delete(local_488.error.message._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488.error.type._M_dataplus._M_p != &local_488.error.type.field_2) {
      operator_delete(local_488.error.type._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488.sighash._M_dataplus._M_p != &local_488.sighash.field_2) {
      operator_delete(local_488.sighash._M_dataplus._M_p);
    }
    CreateSignatureHashRequestStruct::~CreateSignatureHashRequestStruct(&local_308);
    CreateSignatureHashRequest::~CreateSignatureHashRequest(&local_1a0);
    return __return_storage_ptr__;
  }
  uVar2 = std::__throw_bad_function_call();
  CreateSignatureHashResponse::~CreateSignatureHashResponse
            ((CreateSignatureHashResponse *)&local_3c0);
  pjVar1 = (json *)(__return_storage_ptr__->_M_dataplus)._M_p;
  if (pjVar1 != this) {
    operator_delete(pjVar1);
  }
  CreateSignatureHashResponseStruct::~CreateSignatureHashResponseStruct(&local_488);
  CreateSignatureHashRequestStruct::~CreateSignatureHashRequestStruct(&local_308);
  CreateSignatureHashRequest::~CreateSignatureHashRequest(&local_1a0);
  _Unwind_Resume(uVar2);
}

Assistant:

std::string ExecuteJsonApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        call_function) {
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response = call_function(request);
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}